

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

string * __thiscall
NoViableAltException::toString_abi_cxx11_(string *__return_storage_ptr__,NoViableAltException *this)

{
  Ref *pRVar1;
  int __val;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pRVar1 = (this->token).ref;
  if ((pRVar1 == (Ref *)0x0) || (pRVar1->ptr == (Token *)0x0)) {
    (**(code **)(*(long *)&(this->super_ParserException).super_ANTLRException + 0x28))
              (__return_storage_ptr__,this);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"line(",&local_b1);
    __val = (**(code **)(*(long *)&(this->super_ParserException).super_ANTLRException + 0x30))(this)
    ;
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_30,&local_50,"), ");
    (**(code **)(*(long *)&(this->super_ParserException).super_ANTLRException + 0x28))
              (&local_b0,this);
    std::operator+(__return_storage_ptr__,&local_30,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NoViableAltException::toString() const
{
	if (token)
		return std::string("line(")+std::to_string(getLine())+"), "+getErrorMessage();
	else
		return getErrorMessage();
}